

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_command.cpp
# Opt level: O0

void __thiscall duckdb::SleepCommand::ExecuteInternal(SleepCommand *this,ExecuteContext *context)

{
  runtime_error *this_00;
  long in_RDI;
  unsigned_long local_38;
  duration<double,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffffd0;
  duration<double,std::ratio<1l,1000l>> local_28 [8];
  duration<double,std::ratio<1l,1000000l>> local_20 [8];
  duration<double,std::ratio<1l,1000000000l>> local_18 [24];
  
  switch(*(undefined1 *)(in_RDI + 0x98)) {
  case 0:
    std::chrono::duration<double,std::ratio<1l,1000000000l>>::duration<unsigned_long,void>
              (local_18,(unsigned_long *)(in_RDI + 0x90));
    std::this_thread::sleep_for<double,std::ratio<1l,1000000000l>>(in_stack_ffffffffffffffd0);
    break;
  case 1:
    std::chrono::duration<double,std::ratio<1l,1000000l>>::duration<unsigned_long,void>
              (local_20,(unsigned_long *)(in_RDI + 0x90));
    std::this_thread::sleep_for<double,std::ratio<1l,1000000l>>
              ((duration<double,_std::ratio<1L,_1000000L>_> *)in_stack_ffffffffffffffd0);
    break;
  case 2:
    std::chrono::duration<double,std::ratio<1l,1000l>>::duration<unsigned_long,void>
              (local_28,(unsigned_long *)(in_RDI + 0x90));
    std::this_thread::sleep_for<double,std::ratio<1l,1000l>>
              ((duration<double,_std::ratio<1L,_1000L>_> *)in_stack_ffffffffffffffd0);
    break;
  case 3:
    local_38 = *(long *)(in_RDI + 0x90) * 1000;
    std::chrono::duration<double,std::ratio<1l,1000l>>::duration<unsigned_long,void>
              ((duration<double,std::ratio<1l,1000l>> *)&stack0xffffffffffffffd0,&local_38);
    std::this_thread::sleep_for<double,std::ratio<1l,1000l>>
              ((duration<double,_std::ratio<1L,_1000L>_> *)in_stack_ffffffffffffffd0);
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Unrecognized sleep unit");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void SleepCommand::ExecuteInternal(ExecuteContext &context) const {
	switch (unit) {
	case SleepUnit::NANOSECOND:
		std::this_thread::sleep_for(std::chrono::duration<double, std::nano>(duration));
		break;
	case SleepUnit::MICROSECOND:
		std::this_thread::sleep_for(std::chrono::duration<double, std::micro>(duration));
		break;
	case SleepUnit::MILLISECOND:
		std::this_thread::sleep_for(std::chrono::duration<double, std::milli>(duration));
		break;
	case SleepUnit::SECOND:
		std::this_thread::sleep_for(std::chrono::duration<double, std::milli>(duration * 1000));
		break;
	default:
		throw std::runtime_error("Unrecognized sleep unit");
	}
}